

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

void __thiscall QTableModel::sort(QTableModel *this,int column,SortOrder order)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  iterator __seed;
  iterator __last;
  long lVar4;
  int *piVar5;
  QTableWidgetItem *pQVar6;
  pointer ppQVar7;
  ulong uVar8;
  int column_00;
  ulong uVar9;
  int iVar10;
  code *__comp;
  long in_FS_OFFSET;
  QTableWidgetItem *itm;
  undefined8 local_f8;
  QPersistentModelIndex *pQStack_f0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_e8;
  QList<QModelIndex> local_d8;
  QList<QModelIndex> local_b8;
  QList<int> local_98;
  QList<std::pair<QTableWidgetItem_*,_int>_> local_78;
  _Temporary_buffer<QList<std::pair<QTableWidgetItem_*,_int>_>::iterator,_std::pair<QTableWidgetItem_*,_int>_>
  local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar10 = 0;
  local_78.d.size = 0;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (pair<QTableWidgetItem_*,_int> *)0x0;
  local_98.d.size = 0;
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (int *)0x0;
  local_58._M_original_len = -1;
  local_58._M_len = 0;
  local_58._M_buffer = (pointer)0x0;
  uVar2 = (**(code **)(*(long *)this + 0x78))();
  QList<std::pair<QTableWidgetItem_*,_int>_>::reserve(&local_78,(long)(int)uVar2);
  QList<int>::reserve(&local_98,(long)(int)uVar2);
  local_d8.d.d = (Data *)((ulong)local_d8.d.d._4_4_ << 0x20);
  if (0 < (int)uVar2) {
    do {
      local_58._M_original_len = (size_type_conflict1)item(this,iVar10,column);
      if ((QTableWidgetItem *)local_58._M_original_len == (QTableWidgetItem *)0x0) {
        local_b8.d.d = (Data *)CONCAT44(local_b8.d.d._4_4_,(int)local_d8.d.d);
        QtPrivate::QPodArrayOps<int>::emplace<int&>
                  ((QPodArrayOps<int> *)&local_98,local_98.d.size,(int *)&local_b8);
        QList<int>::end(&local_98);
      }
      else {
        QtPrivate::QPodArrayOps<std::pair<QTableWidgetItem*,int>>::emplace<QTableWidgetItem*&,int&>
                  ((QPodArrayOps<std::pair<QTableWidgetItem*,int>> *)&local_78,local_78.d.size,
                   (QTableWidgetItem **)&local_58,(int *)&local_d8);
        QList<std::pair<QTableWidgetItem_*,_int>_>::end(&local_78);
      }
      iVar10 = (int)local_d8.d.d + 1;
      local_d8.d.d = (Data *)CONCAT44(local_d8.d.d._4_4_,iVar10);
    } while (iVar10 < (int)uVar2);
  }
  __comp = itemGreaterThan;
  if (order == AscendingOrder) {
    __comp = itemLessThan;
  }
  __seed = QList<std::pair<QTableWidgetItem_*,_int>_>::begin(&local_78);
  __last = QList<std::pair<QTableWidgetItem_*,_int>_>::end(&local_78);
  if (__seed.i != __last.i) {
    lVar4 = (long)__last.i - (long)__seed.i >> 4;
    local_58._M_buffer = (pointer)&DAT_aaaaaaaaaaaaaaaa;
    local_58._M_original_len = (size_type_conflict1)&DAT_aaaaaaaaaaaaaaaa;
    local_58._M_len = (size_type_conflict1)&DAT_aaaaaaaaaaaaaaaa;
    std::
    _Temporary_buffer<QList<std::pair<QTableWidgetItem_*,_int>_>::iterator,_std::pair<QTableWidgetItem_*,_int>_>
    ::_Temporary_buffer(&local_58,__seed,(lVar4 - (lVar4 + 1 >> 0x3f)) + 1 >> 1);
    if (local_58._M_buffer == (pair<QTableWidgetItem_*,_int> *)0x0) {
      std::
      __inplace_stable_sort<QList<std::pair<QTableWidgetItem*,int>>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<QTableWidgetItem*,int>const&,std::pair<QTableWidgetItem*,int>const&)>>
                (__seed,__last,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<QTableWidgetItem_*,_int>_&,_const_std::pair<QTableWidgetItem_*,_int>_&)>
                  )__comp);
    }
    else {
      std::
      __stable_sort_adaptive<QList<std::pair<QTableWidgetItem*,int>>::iterator,std::pair<QTableWidgetItem*,int>*,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<QTableWidgetItem*,int>const&,std::pair<QTableWidgetItem*,int>const&)>>
                (__seed,__last,local_58._M_buffer,local_58._M_len,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<QTableWidgetItem_*,_int>_&,_const_std::pair<QTableWidgetItem_*,_int>_&)>
                  )__comp);
    }
    operator_delete(local_58._M_buffer,local_58._M_len << 4);
  }
  local_58._M_buffer = (pointer)&DAT_aaaaaaaaaaaaaaaa;
  local_58._M_original_len = (size_type_conflict1)&DAT_aaaaaaaaaaaaaaaa;
  local_58._M_len = (size_type_conflict1)&DAT_aaaaaaaaaaaaaaaa;
  QList<QTableWidgetItem_*>::QList((QList<QTableWidgetItem_*> *)&local_58,(this->tableItems).d.size)
  ;
  local_b8.d.size = 0;
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (QModelIndex *)0x0;
  local_d8.d.size = 0;
  local_d8.d.d = (Data *)0x0;
  local_d8.d.ptr = (QModelIndex *)0x0;
  local_f8 = (Data *)0xffffffffffffffff;
  pQStack_f0 = (QPersistentModelIndex *)0x0;
  tStack_e8.ptr = (QAbstractItemModel *)0x0;
  uVar3 = (**(code **)(*(long *)this + 0x80))(this);
  QList<QModelIndex>::reserve(&local_b8,(long)(int)(uVar3 * uVar2));
  QList<QModelIndex>::reserve(&local_d8,(long)(int)(uVar3 * uVar2));
  if (0 < (int)uVar2) {
    lVar4 = 0;
    uVar8 = 0;
    do {
      piVar5 = &local_78.d.ptr[uVar8].second;
      if ((ulong)local_78.d.size <= uVar8) {
        piVar5 = local_98.d.ptr + (uVar8 - local_78.d.size);
      }
      if (0 < (int)uVar3) {
        iVar10 = *piVar5;
        uVar9 = 0;
        do {
          column_00 = (int)uVar9;
          pQVar6 = item(this,iVar10,column_00);
          lVar1 = (this->horizontalHeaderItems).d.size;
          ppQVar7 = QList<QTableWidgetItem_*>::data((QList<QTableWidgetItem_*> *)&local_58);
          *(QTableWidgetItem **)((long)ppQVar7 + uVar9 * 8 + lVar1 * lVar4) = pQVar6;
          local_f8 = (Data *)CONCAT44(column_00,iVar10);
          pQStack_f0 = (QPersistentModelIndex *)0x0;
          tStack_e8.ptr = (QAbstractItemModel *)this;
          QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex>
                    ((QMovableArrayOps<QModelIndex> *)&local_b8,local_b8.d.size,
                     (QModelIndex *)&local_f8);
          QList<QModelIndex>::end(&local_b8);
          local_f8 = (Data *)CONCAT44(column_00,(int)uVar8);
          pQStack_f0 = (QPersistentModelIndex *)0x0;
          tStack_e8.ptr = (QAbstractItemModel *)this;
          QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex>
                    ((QMovableArrayOps<QModelIndex> *)&local_d8,local_d8.d.size,
                     (QModelIndex *)&local_f8);
          QList<QModelIndex>::end(&local_d8);
          uVar9 = uVar9 + 1;
        } while (uVar3 != uVar9);
      }
      uVar8 = uVar8 + 1;
      lVar4 = lVar4 + 8;
    } while (uVar8 != uVar2);
  }
  local_f8 = (Data *)0x0;
  pQStack_f0 = (QPersistentModelIndex *)0x0;
  tStack_e8.ptr = (QAbstractItemModel *)0x0;
  QAbstractItemModel::layoutAboutToBeChanged
            ((QList_conflict *)this,
             (LayoutChangeHint)(QArrayDataPointer<QPersistentModelIndex> *)&local_f8);
  QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
            ((QArrayDataPointer<QPersistentModelIndex> *)&local_f8);
  QArrayDataPointer<QTableWidgetItem_*>::operator=
            (&(this->tableItems).d,(QArrayDataPointer<QTableWidgetItem_*> *)&local_58);
  QAbstractItemModel::changePersistentIndexList((QList_conflict *)this,(QList_conflict *)&local_b8);
  tStack_e8.ptr = (QAbstractItemModel *)0x0;
  local_f8 = (Data *)0x0;
  pQStack_f0 = (QPersistentModelIndex *)0x0;
  QAbstractItemModel::layoutChanged
            ((QList_conflict *)this,
             (LayoutChangeHint)(QArrayDataPointer<QPersistentModelIndex> *)&local_f8);
  QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
            ((QArrayDataPointer<QPersistentModelIndex> *)&local_f8);
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,0x18,0x10);
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,0x18,0x10);
    }
  }
  if ((QArrayData *)local_58._M_original_len != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_58._M_original_len)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_58._M_original_len)->_q_value).super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_58._M_original_len)->_q_value).super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate((QArrayData *)local_58._M_original_len,8,0x10);
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,0x10,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableModel::sort(int column, Qt::SortOrder order)
{
    QList<std::pair<QTableWidgetItem *, int>> sortable;
    QList<int> unsortable;
    const int numRows = rowCount();

    sortable.reserve(numRows);
    unsortable.reserve(numRows);

    for (int row = 0; row < numRows; ++row) {
        if (QTableWidgetItem *itm = item(row, column))
            sortable.emplace_back(itm, row);
        else
            unsortable.append(row);
    }

    const auto compare = (order == Qt::AscendingOrder ? &itemLessThan : &itemGreaterThan);
    std::stable_sort(sortable.begin(), sortable.end(), compare);

    QList<QTableWidgetItem *> sorted_table(tableItems.size());
    QModelIndexList from;
    QModelIndexList to;
    const int numColumns = columnCount();
    from.reserve(numRows * numColumns);
    to.reserve(numRows * numColumns);
    for (int i = 0; i < numRows; ++i) {
        int r = (i < sortable.size()
                 ? sortable.at(i).second
                 : unsortable.at(i - sortable.size()));
        for (int c = 0; c < numColumns; ++c) {
            sorted_table[tableIndex(i, c)] = item(r, c);
            from.append(createIndex(r, c));
            to.append(createIndex(i, c));
        }
    }

    emit layoutAboutToBeChanged({}, QAbstractItemModel::VerticalSortHint);

    tableItems = sorted_table;
    changePersistentIndexList(from, to); // ### slow

    emit layoutChanged({}, QAbstractItemModel::VerticalSortHint);
}